

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  stbi_uc sVar7;
  int iVar8;
  stbi__uint32 sVar9;
  stbi__uint32 sVar10;
  uint uVar11;
  int depth;
  int iVar12;
  int iVar13;
  undefined8 *puVar14;
  stbi_uc *psVar15;
  stbi_uc *psVar16;
  uint uVar17;
  char *pcVar18;
  long lVar19;
  int *piVar20;
  ulong uVar21;
  stbi_uc *psVar22;
  long lVar23;
  ulong uVar24;
  int out_n;
  ushort uVar25;
  uint uVar26;
  uint x;
  uint y;
  uint uVar27;
  uint color;
  size_t sVar28;
  byte bVar29;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 local_47c;
  stbi__uint32 raw_len;
  ulong local_458;
  long local_450;
  stbi_uc *local_448;
  long local_440;
  stbi_uc palette [1024];
  size_t __size;
  
  tc[0] = '\0';
  tc[1] = '\0';
  tc[2] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar32 = true;
  bVar5 = 0;
  color = 0;
  bVar3 = false;
  uVar27 = 0;
  uVar11 = 0;
  uVar31 = 0;
  bVar4 = false;
  bVar29 = 0;
  while( true ) {
    sVar9 = stbi__get32be(s);
    sVar28 = (size_t)sVar9;
    sVar10 = stbi__get32be(s);
    if (sVar10 != 0x43674249) break;
    bVar3 = true;
LAB_0013f2b8:
    stbi__skip(s,sVar9);
LAB_0013f57d:
    stbi__get32be(s);
  }
  if (sVar10 == 0x49444154) {
    if (!bVar32) {
      if ((bVar29 == 0) || (uVar27 != 0)) {
        if (scan == 2) {
          if (bVar29 != 0) {
            s->img_n = (uint)bVar29;
            return 1;
          }
          return 1;
        }
        if (sVar9 < 0x40000001) {
          uVar30 = uVar31 + sVar9;
          if ((int)uVar30 < (int)uVar31) {
            return 0;
          }
          if (uVar11 < uVar30) {
            if (sVar9 < 0x1001) {
              sVar28 = 0x1000;
            }
            if (uVar11 != 0) {
              sVar28 = (ulong)uVar11;
            }
            do {
              __size = sVar28;
              uVar11 = (uint)__size;
              sVar28 = (ulong)(uVar11 * 2);
            } while (uVar11 < uVar30);
            psVar15 = (stbi_uc *)realloc(*ppsVar1,__size);
            if (psVar15 == (stbi_uc *)0x0) {
              puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
              pcVar18 = "outofmem";
              goto LAB_0013f5fa;
            }
            *ppsVar1 = psVar15;
          }
          else {
            psVar15 = *ppsVar1;
          }
          iVar8 = stbi__getn(s,psVar15 + uVar31,sVar9);
          if (iVar8 != 0) {
LAB_0013f424:
            bVar32 = false;
            uVar31 = uVar30;
            goto LAB_0013f57d;
          }
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar18 = "outofdata";
        }
        else {
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar18 = "IDAT size limit";
        }
      }
      else {
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar18 = "no PLTE";
      }
      goto LAB_0013f5fa;
    }
  }
  else {
    if (sVar10 == 0x49484452) {
      if (!bVar32) {
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar18 = "multiple IHDR";
        goto LAB_0013f5fa;
      }
      if (sVar9 != 0xd) {
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar18 = "bad IHDR len";
        goto LAB_0013f5fa;
      }
      sVar9 = stbi__get32be(s);
      s->img_x = sVar9;
      sVar9 = stbi__get32be(s);
      s->img_y = sVar9;
      if ((sVar9 < 0x1000001) && (s->img_x < 0x1000001)) {
        bVar5 = stbi__get8(s);
        z->depth = (uint)bVar5;
        if ((0x10 < bVar5) || ((0x10116U >> (bVar5 & 0x1f) & 1) == 0)) {
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar18 = "1/2/4/8/16-bit only";
          goto LAB_0013f5fa;
        }
        bVar6 = stbi__get8(s);
        if (bVar6 < 7) {
          color = (uint)bVar6;
          if (bVar6 == 3) {
            bVar29 = 3;
            if (z->depth != 0x10) {
LAB_0013f438:
              sVar7 = stbi__get8(s);
              if (sVar7 != '\0') {
                puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
                pcVar18 = "bad comp method";
                goto LAB_0013f5fa;
              }
              sVar7 = stbi__get8(s);
              if (sVar7 != '\0') {
                puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
                pcVar18 = "bad filter method";
                goto LAB_0013f5fa;
              }
              bVar5 = stbi__get8(s);
              if (1 < bVar5) {
                puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
                pcVar18 = "bad interlace method";
                goto LAB_0013f5fa;
              }
              uVar30 = s->img_x;
              if ((uVar30 == 0) || (s->img_y == 0)) {
                puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
                pcVar18 = "0-pixel image";
                goto LAB_0013f5fa;
              }
              if (bVar29 == 0) {
                uVar17 = (uint)(3 < bVar6) + (bVar6 & 2) + 1;
                s->img_n = uVar17;
                uVar30 = (uint)((0x40000000 / (ulong)uVar30) / (ulong)uVar17);
                bVar29 = 0;
              }
              else {
                s->img_n = 1;
                uVar30 = (uint)(0x40000000 / (ulong)uVar30 >> 2);
              }
              bVar32 = false;
              if (s->img_y <= uVar30) goto LAB_0013f57d;
              goto LAB_0013f58a;
            }
          }
          else if ((bVar6 & 1) == 0) goto LAB_0013f438;
        }
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar18 = "bad ctype";
      }
      else {
LAB_0013f58a:
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar18 = "too large";
      }
      goto LAB_0013f5fa;
    }
    if (sVar10 == 0x504c5445) {
      if (!bVar32) {
        if ((sVar9 < 0x301) && (uVar27 = (sVar9 & 0xffff) / 3, uVar27 * 3 == sVar9)) {
          for (uVar21 = 0; uVar27 != uVar21; uVar21 = uVar21 + 1) {
            sVar7 = stbi__get8(s);
            palette[uVar21 * 4] = sVar7;
            sVar7 = stbi__get8(s);
            palette[uVar21 * 4 + 1] = sVar7;
            sVar7 = stbi__get8(s);
            palette[uVar21 * 4 + 2] = sVar7;
            palette[uVar21 * 4 + 3] = 0xff;
          }
          bVar32 = false;
          goto LAB_0013f57d;
        }
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        pcVar18 = "invalid PLTE";
        goto LAB_0013f5fa;
      }
    }
    else if (sVar10 == 0x74524e53) {
      if (!bVar32) {
        if (*ppsVar1 == (stbi_uc *)0x0) {
          if (bVar29 == 0) {
            uVar30 = s->img_n;
            if ((uVar30 & 1) == 0) {
              puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
              pcVar18 = "tRNS with alpha";
              goto LAB_0013f5fa;
            }
            if (uVar30 * 2 == sVar9) {
              if (scan == 2) {
                s->img_n = uVar30 + 1;
                return 1;
              }
              if (z->depth == 0x10) {
                for (uVar21 = 0; (uVar21 < 3 && ((long)uVar21 < (long)(int)uVar30));
                    uVar21 = uVar21 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc16[uVar21] = (stbi__uint16)iVar8;
                  uVar30 = s->img_n;
                }
              }
              else {
                for (uVar21 = 0; (uVar21 < 3 && ((long)uVar21 < (long)(int)uVar30));
                    uVar21 = uVar21 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc[uVar21] = ""[z->depth] * (char)iVar8;
                  uVar30 = s->img_n;
                }
              }
              bVar32 = false;
              bVar4 = true;
              bVar29 = 0;
              goto LAB_0013f57d;
            }
          }
          else {
            if (scan == 2) {
              s->img_n = 4;
              return 1;
            }
            if (uVar27 == 0) {
              puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
              pcVar18 = "tRNS before PLTE";
              goto LAB_0013f5fa;
            }
            if (sVar9 <= uVar27) {
              for (uVar21 = 0; sVar28 != uVar21; uVar21 = uVar21 + 1) {
                sVar7 = stbi__get8(s);
                palette[uVar21 * 4 + 3] = sVar7;
              }
              bVar29 = 4;
              uVar30 = uVar31;
              goto LAB_0013f424;
            }
          }
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar18 = "bad tRNS len";
        }
        else {
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar18 = "tRNS after IDAT";
        }
        goto LAB_0013f5fa;
      }
    }
    else if (sVar10 == 0x49454e44) {
      if (!bVar32) {
        if (scan != 0) {
          return 1;
        }
        if (*ppsVar1 == (stbi_uc *)0x0) {
          puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
          pcVar18 = "no IDAT";
          goto LAB_0013f5fa;
        }
        raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
        psVar15 = (stbi_uc *)
                  stbi_zlib_decode_malloc_guesssize_headerflag
                            ((char *)*ppsVar1,uVar31,raw_len,(int *)&raw_len,(uint)!bVar3);
        z->expanded = psVar15;
        if (psVar15 == (stbi_uc *)0x0) {
          return 0;
        }
        free(z->idata);
        z->idata = (stbi_uc *)0x0;
        iVar8 = s->img_n + 1;
        iVar13 = s->img_n;
        if (bVar4) {
          iVar13 = iVar8;
        }
        out_n = iVar13;
        if (req_comp != 3) {
          out_n = iVar8;
        }
        if (bVar29 != 0) {
          out_n = iVar13;
        }
        if (iVar8 != req_comp) {
          out_n = iVar13;
        }
        s->img_out_n = out_n;
        psVar15 = z->expanded;
        uVar27 = z->depth;
        local_458 = (ulong)uVar27;
        iVar8 = out_n << (uVar27 == 0x10);
        sVar9 = z->s->img_x;
        sVar10 = z->s->img_y;
        if (bVar5 == 0) {
          iVar8 = stbi__create_png_image_raw(z,psVar15,raw_len,out_n,sVar9,sVar10,uVar27,color);
          if (iVar8 == 0) {
            return 0;
          }
        }
        else {
          local_47c = raw_len;
          psVar16 = (stbi_uc *)stbi__malloc_mad3(sVar9,sVar10,iVar8,0);
          if (psVar16 == (stbi_uc *)0x0) goto LAB_0013fdd5;
          sVar28 = (size_t)iVar8;
          for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
            psVar2 = z->s;
            uVar27 = (&DAT_00159980)[lVar19];
            uVar31 = (&DAT_001599c0)[lVar19];
            uVar26 = ~uVar27 + psVar2->img_x + uVar31;
            x = uVar26 / uVar31;
            uVar11 = (&DAT_001599a0)[lVar19];
            uVar30 = (&DAT_001599e0)[lVar19];
            uVar17 = ~uVar11 + psVar2->img_y + uVar30;
            y = uVar17 / uVar30;
            if ((uVar31 <= uVar26) && (uVar30 <= uVar17)) {
              depth = (int)local_458;
              iVar13 = psVar2->img_n;
              local_450 = lVar19;
              local_448 = psVar15;
              iVar12 = stbi__create_png_image_raw(z,psVar15,local_47c,out_n,x,y,depth,color);
              if (iVar12 == 0) {
                free(psVar16);
                return 0;
              }
              uVar17 = (((int)(x * depth * iVar13 + 7) >> 3) + 1) * y;
              local_440 = (long)(int)y;
              iVar13 = uVar11 * iVar8;
              for (lVar19 = 0; lVar19 < local_440; lVar19 = lVar19 + 1) {
                psVar15 = psVar16 + (long)(int)uVar27 * sVar28;
                for (lVar23 = 0; lVar23 < (int)x; lVar23 = lVar23 + 1) {
                  memcpy(psVar15 + z->s->img_x * iVar13,z->out + (lVar19 * (int)x + lVar23) * sVar28
                         ,sVar28);
                  psVar15 = psVar15 + (long)(int)uVar31 * sVar28;
                }
                iVar13 = iVar13 + uVar30 * iVar8;
              }
              free(z->out);
              psVar15 = local_448 + uVar17;
              local_47c = local_47c - uVar17;
              lVar19 = local_450;
            }
          }
          z->out = psVar16;
        }
        if (bVar4) {
          psVar15 = z->out;
          iVar8 = z->s->img_y * z->s->img_x;
          if (z->depth == 0x10) {
            if (s->img_out_n == 2) {
              for (lVar19 = 0; iVar8 != (int)lVar19; lVar19 = lVar19 + 1) {
                *(ushort *)(psVar15 + lVar19 * 4 + 2) =
                     -(ushort)(*(stbi__uint16 *)(psVar15 + lVar19 * 4) != tc16[0]);
              }
            }
            else {
              for (lVar19 = 0; iVar8 != (int)lVar19; lVar19 = lVar19 + 1) {
                if (((*(stbi__uint16 *)(psVar15 + lVar19 * 8) == tc16[0]) &&
                    (*(stbi__uint16 *)(psVar15 + lVar19 * 8 + 2) == tc16[1])) &&
                   (*(stbi__uint16 *)(psVar15 + lVar19 * 8 + 4) == tc16[2])) {
                  (psVar15 + lVar19 * 8 + 6)[0] = '\0';
                  (psVar15 + lVar19 * 8 + 6)[1] = '\0';
                }
              }
            }
          }
          else if (s->img_out_n == 2) {
            for (lVar19 = 0; iVar8 != (int)lVar19; lVar19 = lVar19 + 1) {
              psVar15[lVar19 * 2 + 1] = -(psVar15[lVar19 * 2] != tc[0]);
            }
          }
          else {
            for (lVar19 = 0; iVar8 != (int)lVar19; lVar19 = lVar19 + 1) {
              if (((psVar15[lVar19 * 4] == tc[0]) && (psVar15[lVar19 * 4 + 1] == tc[1])) &&
                 (psVar15[lVar19 * 4 + 2] == tc[2])) {
                psVar15[lVar19 * 4 + 3] = '\0';
              }
            }
          }
        }
        if (bVar3) {
          lVar19 = __tls_get_addr();
          piVar20 = &stbi__de_iphone_flag_global;
          if (*(int *)(lVar19 + 0x1c) != 0) {
            piVar20 = (int *)(lVar19 + 0x18);
          }
          if ((*piVar20 != 0) && (2 < s->img_out_n)) {
            psVar2 = z->s;
            psVar15 = z->out;
            iVar8 = psVar2->img_y * psVar2->img_x;
            if (psVar2->img_out_n == 3) {
              while (bVar32 = iVar8 != 0, iVar8 = iVar8 + -1, bVar32) {
                sVar7 = *psVar15;
                *psVar15 = psVar15[2];
                psVar15[2] = sVar7;
                psVar15 = psVar15 + 3;
              }
            }
            else {
              piVar20 = &stbi__unpremultiply_on_load_global;
              if (*(int *)(lVar19 + 0x14) != 0) {
                piVar20 = (int *)(lVar19 + 0x10);
              }
              if (*piVar20 == 0) {
                for (lVar19 = 0; iVar8 != (int)lVar19; lVar19 = lVar19 + 1) {
                  sVar7 = psVar15[lVar19 * 4];
                  psVar15[lVar19 * 4] = psVar15[lVar19 * 4 + 2];
                  psVar15[lVar19 * 4 + 2] = sVar7;
                }
              }
              else {
                for (lVar19 = 0; iVar8 != (int)lVar19; lVar19 = lVar19 + 1) {
                  bVar5 = psVar15[lVar19 * 4 + 3];
                  bVar6 = psVar15[lVar19 * 4];
                  if (bVar5 == 0) {
                    psVar15[lVar19 * 4] = psVar15[lVar19 * 4 + 2];
                    psVar15[lVar19 * 4 + 2] = bVar6;
                  }
                  else {
                    uVar27 = (uint)(bVar5 >> 1);
                    uVar25 = (ushort)bVar5;
                    psVar15[lVar19 * 4] =
                         (stbi_uc)(((uint)psVar15[lVar19 * 4 + 2] * 0xff + uVar27 & 0xffff) /
                                  (uint)uVar25);
                    psVar15[lVar19 * 4 + 1] =
                         (stbi_uc)(((uint)psVar15[lVar19 * 4 + 1] * 0xff + uVar27 & 0xffff) /
                                  (uint)uVar25);
                    psVar15[lVar19 * 4 + 2] =
                         (stbi_uc)(((uint)bVar6 * 0xff + uVar27 & 0xffff) / (uint)uVar25);
                  }
                }
              }
            }
          }
        }
        if (bVar29 == 0) {
          if (bVar4) {
            s->img_n = s->img_n + 1;
          }
        }
        else {
          s->img_n = (uint)bVar29;
          uVar27 = (uint)bVar29;
          if (2 < req_comp) {
            uVar27 = req_comp;
          }
          s->img_out_n = uVar27;
          psVar15 = z->out;
          uVar31 = z->s->img_y * z->s->img_x;
          psVar16 = (stbi_uc *)stbi__malloc_mad2(uVar31,uVar27,0);
          if (psVar16 == (stbi_uc *)0x0) {
LAB_0013fdd5:
            puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
            *puVar14 = "outofmem";
            return 0;
          }
          uVar21 = 0;
          psVar22 = psVar16;
          if (uVar27 == 3) {
            for (; uVar31 != uVar21; uVar21 = uVar21 + 1) {
              uVar24 = (ulong)psVar15[uVar21];
              *psVar22 = palette[uVar24 * 4];
              psVar22[1] = palette[uVar24 * 4 + 1];
              psVar22[2] = palette[uVar24 * 4 + 2];
              psVar22 = psVar22 + 3;
            }
          }
          else {
            for (; uVar31 != uVar21; uVar21 = uVar21 + 1) {
              *(undefined4 *)(psVar16 + uVar21 * 4) =
                   *(undefined4 *)(palette + (ulong)psVar15[uVar21] * 4);
            }
          }
          free(psVar15);
          z->out = psVar16;
        }
        free(z->expanded);
        z->expanded = (stbi_uc *)0x0;
        stbi__get32be(s);
        return 1;
      }
    }
    else if (!bVar32) {
      bVar32 = false;
      if ((sVar10 >> 0x1d & 1) == 0) {
        stbi__parse_png_file::invalid_chunk._0_4_ =
             sVar10 >> 0x18 | (sVar10 & 0xff0000) >> 8 | (sVar10 & 0xff00) << 8 | sVar10 << 0x18;
        puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
        *puVar14 = stbi__parse_png_file::invalid_chunk;
        return 0;
      }
      goto LAB_0013f2b8;
    }
  }
  puVar14 = (undefined8 *)__tls_get_addr(&PTR_0016dd60);
  pcVar18 = "first not IHDR";
LAB_0013f5fa:
  *puVar14 = pcVar18;
  return 0;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n && k < 3; ++k) // extra loop test to suppress false GCC warning
                     tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n && k < 3; ++k)
                     tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}